

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

void __thiscall QErrorMessage::showMessage(QErrorMessage *this,QString *message)

{
  QString *in_RSI;
  QErrorMessage *in_RDI;
  long in_FS_OFFSET;
  QString *type;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  type = &local_20;
  QString::QString((QString *)0x748c42);
  showMessage(in_RDI,in_RSI,type);
  QString::~QString((QString *)0x748c5f);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QErrorMessage::showMessage(const QString &message)
{
    showMessage(message, QString());
}